

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

suffix_table_type * __thiscall
frozen::boyer_moore_searcher<7UL>::build_suffix_table
          (suffix_table_type *__return_storage_ptr__,boyer_moore_searcher<7UL> *this,
          char (*needle) [8])

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  size_t p;
  long lVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  long local_58 [4];
  suffix_table_type suffix;
  
  suffix.data_[0] = 0;
  suffix.data_[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  suffix.data_[2] = 0;
  cVar4 = (*needle)[0];
  lVar7 = 6;
  lVar6 = 0;
  lVar9 = 6;
  do {
    lVar1 = lVar9 + 1;
    if (lVar1 == 7) {
LAB_00185a6f:
      lVar7 = lVar1;
    }
    else if (cVar4 == (*needle)[lVar1]) {
      pcVar8 = *needle;
      lVar5 = -1;
      do {
        lVar10 = lVar5;
        if (lVar6 == lVar10) break;
        pcVar2 = pcVar8 + 1;
        pcVar3 = pcVar8 + lVar6 + 8;
        pcVar8 = pcVar8 + 1;
        lVar5 = lVar10 + -1;
      } while (*pcVar2 == *pcVar3);
      if (6U - lVar9 <= (ulong)-lVar10) goto LAB_00185a6f;
    }
    local_58[lVar9] = (lVar7 - lVar9) + 6;
    lVar6 = lVar6 + -1;
    bVar11 = lVar9 == 0;
    lVar9 = lVar9 + -1;
    if (bVar11) {
      lVar7 = 0;
      do {
        if (lVar7 == 0) {
          lVar6 = 0;
        }
        else {
          lVar9 = 0;
          pcVar8 = *needle;
          do {
            lVar6 = lVar9;
            if (pcVar8[lVar7] != pcVar8[6]) break;
            lVar9 = lVar9 + 1;
            pcVar8 = pcVar8 + -1;
            lVar6 = lVar7;
          } while (lVar7 != lVar9);
        }
        if (*(char *)((long)needle + (lVar7 - lVar6)) != *(char *)((long)needle + (6 - lVar6))) {
          local_58[6 - lVar6] = (lVar6 - lVar7) + 6;
        }
        lVar7 = lVar7 + 1;
        if (lVar7 == 6) {
          __return_storage_ptr__->data_[6] = suffix.data_[2];
          __return_storage_ptr__->data_[4] = suffix.data_[0];
          __return_storage_ptr__->data_[5] = suffix.data_[1];
          __return_storage_ptr__->data_[2] = local_58[2];
          __return_storage_ptr__->data_[3] = local_58[3];
          __return_storage_ptr__->data_[0] = local_58[0];
          __return_storage_ptr__->data_[1] = local_58[1];
          return __return_storage_ptr__;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

constexpr auto build_suffix_table(char const (&needle)[size + 1]) {
    suffix_table_type suffix;
    std::ptrdiff_t last_prefix_index = size - 1;

    // first loop
    for (std::ptrdiff_t p = size - 1; p >= 0; p--) {
      if (is_prefix(needle, p + 1))
        last_prefix_index = p + 1;

      suffix[p] = last_prefix_index + (size - 1 - p);
    }

    // second loop
    for (std::size_t p = 0; p < size - 1; p++) {
      auto slen = suffix_length(needle, p);
      if (needle[p - slen] != needle[size - 1 - slen])
        suffix[size - 1 - slen] = size - 1 - p + slen;

    }
    return suffix;
  }